

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayValue.cpp
# Opt level: O2

void __thiscall ArrayValue::SetAtIndex(ArrayValue *this,Value *value,size_t index)

{
  pointer ppVVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = (*value->_vptr_Value[3])(value);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar3))
            (&local_70,(undefined8 *)CONCAT44(extraout_var,iVar3));
  (**(this->element_type_->super_PrimitiveObject).super_Object._vptr_Object)(&local_50);
  bVar2 = std::operator!=(&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Trying to set value of another type");
  }
  else {
    ppVVar1 = (this->buffer_).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (index < (ulong)((long)(this->buffer_).super__Vector_base<Value_*,_std::allocator<Value_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3)) {
      ppVVar1[index] = value;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Index out of bounds");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ArrayValue::SetAtIndex(Value* value, size_t index) {
  if (value->GetType()->GetTypename() !=
      this->GetElementType()->GetTypename()) {
    throw std::runtime_error("Trying to set value of another type");
  } else if (index >= buffer_.size()) {
    throw std::runtime_error("Index out of bounds");
  } else {
    buffer_[index] = value;
  }
}